

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_action(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_action **actions)

{
  lysp_ext_instance **exts;
  lysp_node_action *plVar1;
  lysp_ext_instance *object;
  LY_ERR LVar2;
  lysp_node_action *parent_00;
  lysp_node_action *plVar3;
  char *pcVar4;
  lysp_node_action_inout *inout_p;
  char **ppcVar5;
  ly_ctx *plVar6;
  LY_ERR LVar7;
  ly_stmt lVar8;
  lysp_ext_instance **exts_00;
  char *pcVar9;
  bool bVar10;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff60;
  ly_stmt local_94;
  char *local_90;
  size_t local_88;
  ly_stmt local_7c;
  char **local_78;
  lysp_qname **local_70;
  char **local_68;
  uint16_t *local_60;
  lysp_node_action_inout *local_58;
  lysp_node_action_inout *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node_action *)calloc(1,0x110);
  if (parent_00 == (lysp_node_action *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_action");
  }
  else {
    plVar1 = *actions;
    if (*actions == (lysp_node_action *)0x0) {
      *actions = parent_00;
    }
    else {
      do {
        plVar3 = plVar1;
        plVar1 = (lysp_node_action *)(plVar3->field_0).node.next;
      } while (plVar1 != (lysp_node_action *)0x0);
      (plVar3->field_0).field_1.next = parent_00;
    }
  }
  if (parent_00 == (lysp_node_action *)0x0) {
    LVar7 = LY_EMEM;
  }
  else {
    exts_00 = &local_38;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_90,(char **)exts_00,&local_88);
    LVar7 = LVar2 + (LVar2 == LY_SUCCESS);
    if (LVar2 == LY_SUCCESS) {
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = local_90;
        if (local_88 == 0) {
          pcVar4 = "";
        }
        LVar7 = lydict_insert(plVar6,pcVar4,local_88,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar7 = lydict_insert_zc(plVar6,local_90,&(parent_00->field_0).node.name);
      }
      if (LVar7 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = (ushort)(parent != (lysp_node *)0x0) * 0x100 + 0x100;
        (parent_00->field_0).node.parent = parent;
        LVar7 = get_keyword(ctx,&local_94,&local_90,&local_88);
        if (LVar7 == LY_SUCCESS) {
          if (local_94 == LY_STMT_SYNTAX_SEMICOLON) {
            bVar10 = true;
          }
          else {
            if (local_94 != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(local_94);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
              return LY_EVALID;
            }
            LVar7 = get_keyword(ctx,&local_94,&local_90,&local_88);
            if (LVar7 != LY_SUCCESS) {
              return LVar7;
            }
            bVar10 = local_94 == LY_STMT_SYNTAX_RIGHT_BRACE;
          }
          if (!bVar10) {
            local_7c = (uint)(parent == (lysp_node *)0x0) * 8 + LY_STMT_ACTION;
            exts = &(parent_00->field_0).node.exts;
            local_40 = &parent_00->groupings;
            local_48 = &parent_00->typedefs;
            local_50 = &parent_00->output;
            local_58 = &parent_00->input;
            local_60 = &(parent_00->field_0).node.flags;
            local_68 = &(parent_00->field_0).node.ref;
            local_70 = &(parent_00->field_0).node.iffeatures;
            local_78 = &(parent_00->field_0).node.dsc;
            do {
              if ((int)local_94 < 0xf0000) {
                if ((int)local_94 < 0x800) {
                  if (local_94 == LY_STMT_INPUT) {
                    lVar8 = LY_STMT_INPUT;
                    inout_p = local_58;
                  }
                  else {
                    if (local_94 != LY_STMT_OUTPUT) {
LAB_001784ee:
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar6 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar6 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar4 = lyplg_ext_stmt2str(local_94);
                      pcVar9 = "action";
                      if (parent == (lysp_node *)0x0) {
                        pcVar9 = "rpc";
                      }
                      ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar9);
                      return LY_EVALID;
                    }
                    lVar8 = LY_STMT_OUTPUT;
                    inout_p = local_50;
                  }
                  LVar7 = parse_inout(ctx,lVar8,(lysp_node *)parent_00,inout_p);
                }
                else {
                  if (local_94 != LY_STMT_GROUPING) {
                    if (local_94 != LY_STMT_DESCRIPTION) goto LAB_001784ee;
                    pcVar4 = *local_78;
                    lVar8 = LY_STMT_DESCRIPTION;
                    ppcVar5 = local_78;
                    goto LAB_001783bc;
                  }
                  LVar7 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
                }
              }
              else if ((int)local_94 < 0x270000) {
                if (local_94 == LY_STMT_EXTENSION_INSTANCE) {
                  exts_00 = (lysp_ext_instance **)(ulong)local_7c;
                  LVar7 = parse_ext(ctx,local_90,local_88,parent_00,local_7c,0,exts);
                }
                else {
                  if (local_94 != LY_STMT_IF_FEATURE) goto LAB_001784ee;
                  LVar7 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_70,(yang_arg)exts,exts_00);
                }
              }
              else if (local_94 == LY_STMT_REFERENCE) {
                pcVar4 = *local_68;
                lVar8 = LY_STMT_REFERENCE;
                ppcVar5 = local_68;
LAB_001783bc:
                exts_00 = (lysp_ext_instance **)0x2;
                LVar7 = parse_text_field(ctx,pcVar4,lVar8,(uint32_t)ppcVar5,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff60);
              }
              else if (local_94 == LY_STMT_STATUS) {
                LVar7 = parse_status(ctx,local_60,exts);
              }
              else {
                if (local_94 != LY_STMT_TYPEDEF) goto LAB_001784ee;
                LVar7 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
              }
              if (LVar7 != LY_SUCCESS) {
                return LVar7;
              }
              LVar7 = get_keyword(ctx,&local_94,&local_90,&local_88);
              if (LVar7 != LY_SUCCESS) {
                return LVar7;
              }
              if (local_94 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                object = (parent_00->field_0).node.exts;
                bVar10 = true;
                if ((object != (lysp_ext_instance *)0x0) &&
                   (LVar7 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0),
                   LVar7 != LY_SUCCESS)) {
                  return LVar7;
                }
              }
            } while (!bVar10);
          }
          if ((parent_00->input).field_0.node.nodetype == 0) {
            (parent_00->input).field_0.node.nodetype = 0x1000;
            (parent_00->input).field_0.node.parent = (lysp_node *)parent_00;
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            LVar7 = lydict_insert(plVar6,"input",0,&(parent_00->input).field_0.node.name);
            if (LVar7 != LY_SUCCESS) {
              return LVar7;
            }
          }
          LVar7 = LY_SUCCESS;
          if ((parent_00->output).field_0.node.nodetype == 0) {
            (parent_00->output).field_0.node.nodetype = 0x2000;
            (parent_00->output).field_0.node.parent = (lysp_node *)parent_00;
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            LVar7 = lydict_insert(plVar6,"output",0,&(parent_00->output).field_0.node.name);
          }
        }
      }
    }
  }
  return LVar7;
}

Assistant:

LY_ERR
parse_action(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_action **actions)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_action *act;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), actions, act, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, act->name, word, word_len, ret, cleanup);
    act->nodetype = parent ? LYS_ACTION : LYS_RPC;
    act->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, act->dsc, LY_STMT_DESCRIPTION, 0, &act->dsc, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &act->iffeatures, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, act->ref, LY_STMT_REFERENCE, 0, &act->ref, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &act->flags, &act->exts));
            break;

        case LY_STMT_INPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->input));
            break;
        case LY_STMT_OUTPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->output));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)act, &act->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)act, &act->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, act, parent ? LY_STMT_ACTION : LY_STMT_RPC, 0, &act->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), parent ? "action" : "rpc");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, act->exts, ret, cleanup);
    }

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

cleanup:
    return ret;
}